

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void __thiscall
Js::CompoundString::
AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
          (CompoundString *this,undefined8 value,undefined4 maximumAppendCharLength)

{
  CharCount maximumAppendCharLength_local;
  unsigned_short *value_local;
  CompoundString *this_local;
  
  AppendGeneric<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0,Js::CompoundString>
            (value,maximumAppendCharLength,this,1);
  return;
}

Assistant:

inline void CompoundString::AppendChars(
        const TValue &value,
        const CharCount maximumAppendCharLength,
        const FConvertToString ConvertToString)
    {
        AppendGeneric(value, maximumAppendCharLength, ConvertToString, this, true);
    }